

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::BinaryWriter::startNewEntity(BinaryWriter *this)

{
  shared_ptr<pbrt::SerializedEntity> local_20;
  
  std::make_shared<pbrt::SerializedEntity>();
  std::
  deque<std::shared_ptr<pbrt::SerializedEntity>,std::allocator<std::shared_ptr<pbrt::SerializedEntity>>>
  ::emplace_back<std::shared_ptr<pbrt::SerializedEntity>>
            ((deque<std::shared_ptr<pbrt::SerializedEntity>,std::allocator<std::shared_ptr<pbrt::SerializedEntity>>>
              *)this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void startNewEntity()
    { serializedEntity.push(std::make_shared<SerializedEntity>()); }